

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

uint16_t icu_63::writeFactorSuffix
                   (uint16_t *factors,uint16_t count,char *s,uint32_t code,uint16_t *indexes,
                   char **elementBases,char **elements,char *buffer,uint16_t bufferLength)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  short sVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  
  uVar7 = count - 1;
  uVar9 = (ulong)uVar7;
  uVar8 = uVar9;
  uVar3 = (ulong)code;
  uVar10 = uVar7;
  while (uVar10 != 0) {
    uVar2 = uVar3 / factors[uVar8];
    code = (uint32_t)uVar2;
    uVar7 = 0;
    indexes[uVar8] = (uint16_t)(uVar3 % (ulong)factors[uVar8]);
    uVar10 = (ushort)(uVar8 - 1);
    uVar8 = uVar8 - 1;
    uVar3 = uVar2;
  }
  *indexes = (uint16_t)code;
  uVar8 = (ulong)uVar7;
  uVar4 = 0;
  while( true ) {
    if (elementBases == (char **)0x0) {
      elementBases = (char **)0x0;
    }
    else {
      *elementBases = s;
      elementBases = elementBases + 1;
    }
    for (uVar5 = indexes[uVar8]; uVar5 != 0; uVar5 = uVar5 - 1) {
      do {
        cVar1 = *s;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    if (elements == (char **)0x0) {
      elements = (char **)0x0;
    }
    else {
      *elements = s;
      elements = elements + 1;
    }
    while( true ) {
      cVar1 = *s;
      s = s + 1;
      if (cVar1 == '\0') break;
      if (bufferLength != 0) {
        *buffer = cVar1;
        buffer = buffer + 1;
        bufferLength = bufferLength - 1;
      }
      uVar4 = uVar4 + 1;
    }
    if (uVar8 == uVar9) break;
    for (sVar6 = ~indexes[uVar8] + factors[uVar8]; sVar6 != 0; sVar6 = sVar6 + -1) {
      do {
        cVar1 = *s;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    uVar8 = uVar8 + 1;
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return uVar4;
}

Assistant:

static uint16_t
writeFactorSuffix(const uint16_t *factors, uint16_t count,
                  const char *s, /* suffix elements */
                  uint32_t code,
                  uint16_t indexes[8], /* output fields from here */
                  const char *elementBases[8], const char *elements[8],
                  char *buffer, uint16_t bufferLength) {
    uint16_t i, factor, bufferPos=0;
    char c;

    /* write elements according to the factors */

    /*
     * the factorized elements are determined by modulo arithmetic
     * with the factors of this algorithm
     *
     * note that for fewer operations, count is decremented here
     */
    --count;
    for(i=count; i>0; --i) {
        factor=factors[i];
        indexes[i]=(uint16_t)(code%factor);
        code/=factor;
    }
    /*
     * we don't need to calculate the last modulus because start<=code<=end
     * guarantees here that code<=factors[0]
     */
    indexes[0]=(uint16_t)code;

    /* write each element */
    for(;;) {
        if(elementBases!=NULL) {
            *elementBases++=s;
        }

        /* skip indexes[i] strings */
        factor=indexes[i];
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }
        if(elements!=NULL) {
            *elements++=s;
        }

        /* write element */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* we do not need to perform the rest of this loop for i==count - break here */
        if(i>=count) {
            break;
        }

        /* skip the rest of the strings for this factors[i] */
        factor=(uint16_t)(factors[i]-indexes[i]-1);
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }

        ++i;
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}